

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_regtest.cc
# Opt level: O0

void ReadToString(string *filename,string *s)

{
  FILE *pFVar1;
  string *psVar2;
  int iVar3;
  char *pcVar4;
  allocator local_1fe9;
  string local_1fe8 [32];
  FILE *local_1fc8;
  FILE *fp;
  size_t n;
  char buffer [8092];
  int bufsize;
  string *s_local;
  string *filename_local;
  
  buffer[0x1f94] = -100;
  buffer[0x1f95] = '\x1f';
  buffer[0x1f96] = '\0';
  buffer[0x1f97] = '\0';
  unique0x1000017e = s;
  pcVar4 = (char *)std::__cxx11::string::c_str();
  local_1fc8 = fopen(pcVar4,"rb");
  if (local_1fc8 == (FILE *)0x0) {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    perror(pcVar4);
    exit(1);
  }
  while( true ) {
    fp = (FILE *)fread(&n,1,0x1f9c,local_1fc8);
    if (fp == (FILE *)0x0) {
      fclose(local_1fc8);
      return;
    }
    iVar3 = ferror(local_1fc8);
    psVar2 = (string *)stack0xffffffffffffffe8;
    pFVar1 = fp;
    if (iVar3 != 0) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1fe8,(char *)&n,(ulong)pFVar1,&local_1fe9);
    std::__cxx11::string::append(psVar2);
    std::__cxx11::string::~string(local_1fe8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1fe9);
  }
  pcVar4 = (char *)std::__cxx11::string::c_str();
  perror(pcVar4);
  exit(1);
}

Assistant:

static void ReadToString(const string& filename, string* s) {
  const int bufsize = 8092;
  char buffer[bufsize];
  size_t n;
  FILE* fp = fopen(filename.c_str(), "rb");
  if (!fp)  PFATAL(filename.c_str());
  while ((n=fread(buffer, 1, bufsize, fp)) > 0) {
    if (ferror(fp))  PFATAL(filename.c_str());
    s->append(string(buffer, n));
  }
  fclose(fp);
}